

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

int64_t __thiscall absl::ToInt64Nanoseconds(absl *this,Duration d)

{
  int64_t iVar1;
  Duration num;
  Duration local_10;
  
  if ((ulong)this >> 0x21 == 0) {
    return ((ulong)d.rep_hi_ >> 2 & 0x3fffffff) + (long)this * 1000000000;
  }
  local_10.rep_lo_ = (uint32_t)d.rep_hi_;
  num._8_8_ = d.rep_hi_ & 0xffffffff;
  num.rep_hi_ = (int64_t)this;
  local_10.rep_hi_ = (int64_t)this;
  iVar1 = time_internal::IDivDuration(true,num,(Duration)(ZEXT816(4) << 0x40),&local_10);
  return iVar1;
}

Assistant:

int64_t ToInt64Nanoseconds(Duration d) {
  if (time_internal::GetRepHi(d) >= 0 &&
      time_internal::GetRepHi(d) >> 33 == 0) {
    return (time_internal::GetRepHi(d) * 1000 * 1000 * 1000) +
           (time_internal::GetRepLo(d) / kTicksPerNanosecond);
  }
  return d / Nanoseconds(1);
}